

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapKey::CopyFrom(MapKey *this,MapKey *other)

{
  CppType type;
  LogMessage *other_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  type = MapKey::type(other);
  SetType(this,type);
  switch(this->type_) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    (this->val_).int32_value_ = (other->val_).int32_value_;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    (this->val_).int64_value_ = (other->val_).int64_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0xd5);
    other_00 = internal::LogMessage::operator<<(&local_48,"Unsupported");
    internal::LogFinisher::operator=(&local_49,other_00);
    internal::LogMessage::~LogMessage(&local_48);
    break;
  case CPPTYPE_BOOL:
    (this->val_).bool_value_ = (other->val_).bool_value_;
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::_M_assign((string *)this);
    return;
  }
  return;
}

Assistant:

void CopyFrom(const MapKey& other) {
    SetType(other.type());
    switch (type_) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        *val_.string_value_.get_mutable() = other.val_.string_value_.get();
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        val_.int64_value_ = other.val_.int64_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        val_.int32_value_ = other.val_.int32_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        val_.uint64_value_ = other.val_.uint64_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        val_.uint32_value_ = other.val_.uint32_value_;
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        val_.bool_value_ = other.val_.bool_value_;
        break;
    }
  }